

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,ExtendedRegisters dest,Registers srcMemReg,int offset)

{
  undefined3 in_register_00000011;
  Registers *__args;
  size_t i;
  long lVar1;
  IntToBytes converter;
  Registers local_2b;
  Registers local_2a;
  uchar local_29 [2];
  Registers local_27;
  uchar local_26 [2];
  int local_24;
  
  if (CONCAT31(in_register_00000011,srcMemReg) == 4) {
    local_29[1] = 0x4c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29 + 1);
    local_29[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_29);
    local_2a = dest << 3 | 0x84;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,&local_2a);
    __args = &local_2b;
    local_2b = 0x24;
  }
  else {
    local_26[1] = 0x4c;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_26 + 1);
    local_26[0] = 0x8b;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,local_26);
    local_27 = dest << 3 | srcMemReg | 0x80;
    __args = &local_27;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (codeGen,__args);
  local_24 = offset;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,(value_type_conflict2 *)((long)&local_24 + lVar1));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, ExtendedRegisters dest, Registers srcMemReg, int offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0x4c);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0x4c);
			codeGen.push_back(0x8b);
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}